

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry-inl.h
# Opt level: O3

void __thiscall spdlog::details::registry::set_level(registry *this,level_enum log_level)

{
  int iVar1;
  _Hash_node_base *p_Var2;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar1 == 0) {
    for (p_Var2 = (this->loggers_)._M_h._M_before_begin._M_nxt; p_Var2 != (_Hash_node_base *)0x0;
        p_Var2 = p_Var2->_M_nxt) {
      LOCK();
      *(level_enum *)&p_Var2[5]._M_nxt[8]._M_nxt = log_level;
      UNLOCK();
    }
    (this->levels_).default_level_ = log_level;
    pthread_mutex_unlock((pthread_mutex_t *)this);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

SPDLOG_INLINE void registry::set_level(level::level_enum log_level)
{
    std::lock_guard<std::mutex> lock(logger_map_mutex_);
    for (auto &l : loggers_)
    {
        l.second->set_level(log_level);
    }
    levels_.set_default(log_level);
}